

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QTreeWidgetItem * __thiscall QTreeWidget::itemBelow(QTreeWidget *this,QTreeWidgetItem *item)

{
  QTreeWidgetPrivate *__s;
  QTreeModel *pQVar1;
  QTreeWidgetItem *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetPrivate *d;
  QModelIndex below;
  QModelIndex index;
  QModelIndex *in_stack_ffffffffffffff88;
  QTreeWidgetPrivate *in_stack_ffffffffffffff90;
  QTreeView *in_stack_ffffffffffffffc0;
  QTreeWidgetItem *pQVar2;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = d_func((QTreeWidget *)0x918def);
  pQVar1 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x918e08);
  if (in_RSI == pQVar1->headerItem) {
    pQVar2 = (QTreeWidgetItem *)0x0;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTreeWidgetPrivate::index((QTreeWidgetPrivate *)&local_20,(char *)__s,(int)in_RSI);
    QTreeView::indexBelow(in_stack_ffffffffffffffc0,in_RDI);
    pQVar2 = QTreeWidgetPrivate::item(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidget::itemBelow(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    if (item == d->treeModel()->headerItem)
        return nullptr;
    const QModelIndex index = d->index(item);
    const QModelIndex below = indexBelow(index);
    return d->item(below);
}